

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  string_view_t view;
  string_view_t view_00;
  string_view_t view_01;
  string_view_t view_02;
  bool bVar1;
  size_t sVar2;
  buffer<char> *this_00;
  char *pcVar3;
  memory_buf_t *in_RCX;
  basic_string_view<char> *in_RSI;
  memory_buf_t *in_RDI;
  char *filename;
  duration<long,_std::ratio<1L,_1000L>_> millis;
  __enable_if_is_duration<std::chrono::duration<long>_> secs;
  duration duration;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff38;
  memory_buf_t *dest_00;
  buffer<char> *in_stack_ffffffffffffff40;
  memory_buf_t *in_stack_ffffffffffffff50;
  time_point in_stack_ffffffffffffff58;
  undefined5 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  memory_buf_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  rep local_30;
  rep local_28;
  memory_buf_t *local_20;
  basic_string_view<char> *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_28 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&in_RSI[1].size_);
  local_30 = (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                             in_stack_ffffffffffffff38);
  bVar1 = std::chrono::operator!=
                    ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff38);
  if (!bVar1) {
    sVar2 = ::fmt::v6::internal::buffer<char>::size((buffer<char> *)in_RDI->store_);
    if (sVar2 != 0) goto LAB_001b7d03;
  }
  ::fmt::v6::internal::buffer<char>::clear((buffer<char> *)in_RDI->store_);
  local_31 = 0x5b;
  ::fmt::v6::internal::buffer<char>::push_back
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  fmt_helper::append_int<int>(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  local_32 = 0x2d;
  ::fmt::v6::internal::buffer<char>::push_back
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  fmt_helper::pad2((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_RDI);
  local_33 = 0x2d;
  ::fmt::v6::internal::buffer<char>::push_back
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  fmt_helper::pad2((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_RDI);
  local_34 = 0x20;
  ::fmt::v6::internal::buffer<char>::push_back
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  fmt_helper::pad2((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_RDI);
  local_35 = 0x3a;
  ::fmt::v6::internal::buffer<char>::push_back
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  fmt_helper::pad2((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_RDI);
  local_36 = 0x3a;
  ::fmt::v6::internal::buffer<char>::push_back
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  fmt_helper::pad2((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_RDI);
  local_37 = 0x2e;
  ::fmt::v6::internal::buffer<char>::push_back
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  *(rep *)&in_RDI->field_0x18 = local_30;
LAB_001b7d03:
  dest_00 = local_20;
  this_00 = (buffer<char> *)::fmt::v6::internal::buffer<char>::begin((buffer<char> *)in_RDI->store_)
  ;
  ::fmt::v6::internal::buffer<char>::end((buffer<char> *)in_RDI->store_);
  ::fmt::v6::internal::buffer<char>::append<char>
            ((buffer<char> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (char *)in_stack_ffffffffffffff68,
             (char *)CONCAT17(in_stack_ffffffffffffff67,
                              CONCAT16(in_stack_ffffffffffffff66,
                                       CONCAT15(in_stack_ffffffffffffff65,in_stack_ffffffffffffff60)
                                      )));
  local_40 = fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000l>>>
                       (in_stack_ffffffffffffff58);
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_40);
  fmt_helper::pad3<unsigned_int>((uint)((ulong)this_00 >> 0x20),dest_00);
  ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
  ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
  sVar2 = ::fmt::v6::basic_string_view<char>::size(local_10);
  if (sVar2 != 0) {
    ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
    view.size_._0_5_ = in_stack_ffffffffffffff60;
    view.data_ = (char *)in_stack_ffffffffffffff58.__d.__r;
    view.size_._5_1_ = in_stack_ffffffffffffff65;
    view.size_._6_1_ = in_stack_ffffffffffffff66;
    view.size_._7_1_ = in_stack_ffffffffffffff67;
    fmt_helper::append_string_view(view,in_stack_ffffffffffffff50);
    ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
    ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
  }
  ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
  sVar2 = ::fmt::v6::internal::buffer<char>::size((buffer<char> *)local_20);
  local_10[2].size_ = sVar2;
  level::to_string_view(*(level_enum *)&local_10[1].data_);
  view_00.size_._0_5_ = in_stack_ffffffffffffff60;
  view_00.data_ = (char *)in_stack_ffffffffffffff58.__d.__r;
  view_00.size_._5_1_ = in_stack_ffffffffffffff65;
  view_00.size_._6_1_ = in_stack_ffffffffffffff66;
  view_00.size_._7_1_ = in_stack_ffffffffffffff67;
  fmt_helper::append_string_view(view_00,in_stack_ffffffffffffff50);
  pcVar3 = (char *)::fmt::v6::internal::buffer<char>::size((buffer<char> *)local_20);
  local_10[3].data_ = pcVar3;
  ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
  ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
  bVar1 = source_loc::empty((source_loc *)&local_10[3].size_);
  if (!bVar1) {
    ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
    short_filename_formatter<spdlog::details::null_scoped_padder>::basename
              ((char *)local_10[3].size_);
    ::fmt::v6::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)this_00,(char *)dest_00);
    view_01.size_._0_5_ = in_stack_ffffffffffffff60;
    view_01.data_ = (char *)in_stack_ffffffffffffff58.__d.__r;
    view_01.size_._5_1_ = in_stack_ffffffffffffff65;
    view_01.size_._6_1_ = in_stack_ffffffffffffff66;
    view_01.size_._7_1_ = in_stack_ffffffffffffff67;
    fmt_helper::append_string_view(view_01,in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff67 = 0x3a;
    ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
    fmt_helper::append_int<int>(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff66 = 0x5d;
    ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
    in_stack_ffffffffffffff65 = 0x20;
    ::fmt::v6::internal::buffer<char>::push_back(this_00,(char *)dest_00);
  }
  view_02.size_._0_5_ = in_stack_ffffffffffffff60;
  view_02.data_ = (char *)local_10[5].size_;
  view_02.size_._5_1_ = in_stack_ffffffffffffff65;
  view_02.size_._6_1_ = in_stack_ffffffffffffff66;
  view_02.size_._7_1_ = in_stack_ffffffffffffff67;
  fmt_helper::append_string_view(view_02,(memory_buf_t *)local_10[5].data_);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0)
        {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

        // append logger name if exists
        if (msg.logger_name.size() > 0)
        {
            dest.push_back('[');
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty())
        {
            dest.push_back('[');
            const char *filename = details::short_filename_formatter<details::null_scoped_padder>::basename(msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }